

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkExtent2D Diligent::ShadingRateToVkFragmentSize(SHADING_RATE Rate)

{
  VkExtent2D VVar1;
  undefined8 in_RCX;
  byte bVar2;
  SHADING_RATE SVar3;
  string msg;
  string local_38;
  
  bVar2 = Rate >> 2 & 3;
  SVar3 = Rate & (SHADING_RATE_1X4|SHADING_RATE_1X2);
  if (SVar3 == (SHADING_RATE_1X4|SHADING_RATE_1X2) || bVar2 == 3) {
    FormatString<char[26],char[96]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Result.width <= (1u << AXIS_SHADING_RATE_MAX) && Result.height <= (1u << AXIS_SHADING_RATE_MAX)"
               ,(char (*) [96])
                CONCAT71((int7)((ulong)in_RCX >> 8),SVar3 != (SHADING_RATE_1X4|SHADING_RATE_1X2)));
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"ShadingRateToVkFragmentSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x774);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  VVar1.width = 1 << bVar2;
  VVar1.height = 1 << SVar3;
  return VVar1;
}

Assistant:

VkExtent2D ShadingRateToVkFragmentSize(SHADING_RATE Rate)
{
    VkExtent2D Result;
    Result.width  = 1u << ((Uint32{Rate} >> SHADING_RATE_X_SHIFT) & 0x3);
    Result.height = 1u << (Uint32{Rate} & 0x3);
    VERIFY_EXPR(Result.width > 0 && Result.height > 0);
    VERIFY_EXPR(Result.width <= (1u << AXIS_SHADING_RATE_MAX) && Result.height <= (1u << AXIS_SHADING_RATE_MAX));
    VERIFY_EXPR(IsPowerOfTwo(Result.width) && IsPowerOfTwo(Result.height));
    return Result;
}